

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int bam_readrec(BGZF *fp,void *ignored,void *bv,int *tid,int *beg,int *end)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  iVar2 = bam_read1(fp,(bam1_t *)bv);
  if (-1 < iVar2) {
    *tid = *bv;
    *beg = *(int *)((long)bv + 4);
    uVar3 = *(ulong *)((long)bv + 8) >> 0x30;
    iVar4 = 1;
    if (uVar3 != 0) {
      uVar5 = 0;
      iVar4 = 0;
      do {
        uVar1 = *(uint *)((*(ulong *)((long)bv + 8) >> 0x18 & 0xff) + *(long *)((long)bv + 0x28) +
                         uVar5 * 4);
        iVar4 = iVar4 + (uVar1 >> 4 &
                        (int)((0x3c1a7U >> ((char)uVar1 * '\x02' & 0x1fU)) << 0x1e) >> 0x1f);
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
    }
    *end = iVar4 + *(int *)((long)bv + 4);
  }
  return iVar2;
}

Assistant:

static int bam_readrec(BGZF *fp, void *ignored, void *bv, int *tid, int *beg, int *end)
{
    bam1_t *b = bv;
    int ret;
    if ((ret = bam_read1(fp, b)) >= 0) {
        *tid = b->core.tid; *beg = b->core.pos;
        *end = b->core.pos + (b->core.n_cigar? bam_cigar2rlen(b->core.n_cigar, bam_get_cigar(b)) : 1);
    }
    return ret;
}